

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test10::typeDetails::typeDetails
          (typeDetails *this,GLuint n_columns,GLuint n_rows)

{
  GLenum GVar1;
  _variable_type type_00;
  string local_50;
  _variable_type local_1c;
  GLuint local_18;
  _variable_type type;
  GLuint n_rows_local;
  GLuint n_columns_local;
  typeDetails *this_local;
  
  this->m_n_columns = n_columns;
  this->m_n_rows = n_rows;
  local_18 = n_rows;
  type = n_columns;
  _n_rows_local = this;
  std::__cxx11::string::string((string *)&this->m_type_name);
  local_1c = Utils::getDoubleVariableType(type,local_18);
  GVar1 = Utils::getGLDataTypeOfVariableType(local_1c);
  this->m_type = GVar1;
  Utils::getVariableTypeString_abi_cxx11_(&local_50,(Utils *)(ulong)local_1c,type_00);
  std::__cxx11::string::operator=((string *)&this->m_type_name,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (this->m_n_columns == 1) {
    if (this->m_n_rows == 1) {
      this->m_general_type = SCALAR;
    }
    else {
      this->m_general_type = VECTOR;
    }
  }
  else {
    this->m_general_type = MATRIX;
  }
  return;
}

Assistant:

GPUShaderFP64Test10::typeDetails::typeDetails(glw::GLuint n_columns, glw::GLuint n_rows)
	: m_n_columns(n_columns), m_n_rows(n_rows)
{
	Utils::_variable_type type = Utils::getDoubleVariableType(n_columns, n_rows);
	m_type					   = Utils::getGLDataTypeOfVariableType(type);
	m_type_name				   = Utils::getVariableTypeString(type);

	if (1 == m_n_columns)
	{
		if (1 == m_n_rows)
		{
			m_general_type = SCALAR;
		}
		else
		{
			m_general_type = VECTOR;
		}
	}
	else
	{
		m_general_type = MATRIX;
	}
}